

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

PaddingLayerParams_PaddingReplication * __thiscall
CoreML::Specification::PaddingLayerParams::mutable_replication(PaddingLayerParams *this)

{
  PaddingLayerParams_PaddingConstant *this_00;
  
  if (this->_oneof_case_[0] == 3) {
    this_00 = (this->PaddingType_).constant_;
  }
  else {
    clear_PaddingType(this);
    this->_oneof_case_[0] = 3;
    this_00 = (PaddingLayerParams_PaddingConstant *)operator_new(0x18);
    PaddingLayerParams_PaddingReplication::PaddingLayerParams_PaddingReplication
              ((PaddingLayerParams_PaddingReplication *)this_00);
    (this->PaddingType_).replication_ = (PaddingLayerParams_PaddingReplication *)this_00;
  }
  return (PaddingLayerParams_PaddingReplication *)this_00;
}

Assistant:

inline ::CoreML::Specification::PaddingLayerParams_PaddingReplication* PaddingLayerParams::mutable_replication() {
  if (!has_replication()) {
    clear_PaddingType();
    set_has_replication();
    PaddingType_.replication_ = new ::CoreML::Specification::PaddingLayerParams_PaddingReplication;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.PaddingLayerParams.replication)
  return PaddingType_.replication_;
}